

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O1

void SUNDenseMatrix_Print(SUNMatrix A,FILE *outfile)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  
  fputc(10,(FILE *)outfile);
  if (0 < *A->content) {
    lVar2 = 0;
    do {
      pvVar1 = A->content;
      if (0 < *(long *)((long)pvVar1 + 8)) {
        lVar3 = 0;
        do {
          fprintf((FILE *)outfile,"% .15e  ",
                  *(undefined8 *)(*(long *)(*(long *)((long)pvVar1 + 0x20) + lVar3 * 8) + lVar2 * 8)
                 );
          lVar3 = lVar3 + 1;
          pvVar1 = A->content;
        } while (lVar3 < *(long *)((long)pvVar1 + 8));
      }
      fputc(10,(FILE *)outfile);
      lVar2 = lVar2 + 1;
    } while (lVar2 < *A->content);
  }
  return;
}

Assistant:

void SUNDenseMatrix_Print(SUNMatrix A, FILE* outfile)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j;

  SUNAssertVoid(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);

  /* perform operation */
  fprintf(outfile, "\n");
  for (i = 0; i < SM_ROWS_D(A); i++)
  {
    for (j = 0; j < SM_COLUMNS_D(A); j++)
    {
      fprintf(outfile, SUN_FORMAT_E "  ", SM_ELEMENT_D(A, i, j));
    }
    fprintf(outfile, "\n");
  }
  return;
}